

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O0

string * __thiscall CppGenerator::genCaseIdentifiers_abi_cxx11_(CppGenerator *this)

{
  element_type *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  CppGenerator *in_RDI;
  size_t view;
  size_t rel;
  string returnString;
  size_t in_stack_fffffffffffffdd8;
  TreeDecomposition *in_stack_fffffffffffffde0;
  string *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffde8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs_00;
  CppGenerator *this_01;
  string local_1d0 [32];
  string local_1b0 [32];
  string local_190 [32];
  string local_170 [32];
  string local_150 [32];
  string local_130 [32];
  string local_110 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_f0;
  string local_e8 [32];
  string local_c8 [32];
  string local_a8 [32];
  string local_88 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_68;
  string local_50 [32];
  string local_30 [48];
  
  this_01 = in_RDI;
  offset_abi_cxx11_(in_RDI,(size_t)in_RDI);
  std::operator+(in_stack_fffffffffffffde8,(char *)in_stack_fffffffffffffde0);
  std::__cxx11::string::~string(local_50);
  local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  while( true ) {
    __rhs_00 = local_68;
    this_00 = std::__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x289937);
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            TreeDecomposition::numberOfRelations(this_00);
    if (__lhs <= __rhs_00) break;
    offset_abi_cxx11_(this_01,(size_t)in_RDI);
    std::operator+((char *)in_stack_fffffffffffffde8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffde0);
    std::__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x28999e);
    TreeDecomposition::getRelation(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
    std::operator+(in_stack_fffffffffffffde8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffde0);
    std::operator+(in_stack_fffffffffffffde8,(char *)in_stack_fffffffffffffde0);
    std::__cxx11::string::operator+=(local_30,local_88);
    std::__cxx11::string::~string(local_88);
    std::__cxx11::string::~string(local_a8);
    std::__cxx11::string::~string(local_c8);
    std::__cxx11::string::~string(local_e8);
    local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &local_68->field_0x1;
  }
  local_f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  while( true ) {
    __lhs_00 = local_f0;
    std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x289b48);
    pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             QueryCompiler::numberOfViews((QueryCompiler *)0x289b50);
    if (pbVar1 <= __lhs_00) break;
    offset_abi_cxx11_(this_01,(size_t)in_RDI);
    std::operator+((char *)__lhs_00,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffde0);
    std::operator+(__lhs_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffde0);
    std::operator+(__lhs_00,(char *)in_stack_fffffffffffffde0);
    std::__cxx11::string::operator+=(local_30,local_110);
    std::__cxx11::string::~string(local_110);
    std::__cxx11::string::~string(local_130);
    std::__cxx11::string::~string(local_150);
    std::__cxx11::string::~string(local_170);
    local_f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &local_f0->field_0x1;
  }
  __rhs = local_30;
  std::__cxx11::string::pop_back();
  std::operator+(__lhs,(char *)__rhs_00);
  offset_abi_cxx11_(this_01,(size_t)in_RDI);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
  std::operator+(__lhs_00,(char *)__rhs);
  std::__cxx11::string::~string(local_190);
  std::__cxx11::string::~string(local_1d0);
  std::__cxx11::string::~string(local_1b0);
  std::__cxx11::string::~string(local_30);
  return (string *)this_01;
}

Assistant:

std::string CppGenerator::genCaseIdentifiers()
{
    std::string returnString = offset(1)+"enum ID {";

    for (size_t rel = 0; rel < _td->numberOfRelations(); ++rel)
        returnString += "\n"+offset(2)+_td->getRelation(rel)->_name+"_ID,";

    for (size_t view = 0; view < _qc->numberOfViews(); ++view)
        returnString += "\n"+offset(2)+viewName[view]+"_ID,";
    returnString.pop_back();

    return returnString+"\n"+offset(1)+"};\n";
}